

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

ComparisonStatusFlags __thiscall
Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::operator()
          (Comparator<Corrade::TestSuite::Compare::File> *this,StringView actualFilename,
          StringView expectedFilename)

{
  Comparator<Corrade::TestSuite::Compare::File> *pCVar1;
  bool bVar2;
  byte bVar3;
  State *pSVar4;
  type *ptVar5;
  ComparisonStatusFlags local_189;
  undefined1 local_188 [24];
  undefined8 local_170;
  String local_168;
  ComparisonStatusFlags local_149;
  undefined1 local_148 [16];
  undefined1 local_138 [8];
  Optional<Corrade::Containers::String> expectedContents;
  undefined1 local_f8 [16];
  undefined1 local_e8 [8];
  Optional<Corrade::Containers::String> actualContents;
  String local_a0;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  char *local_68;
  size_t sStack_60;
  String local_50;
  Comparator<Corrade::TestSuite::Compare::File> *local_38;
  Comparator<Corrade::TestSuite::Compare::File> *this_local;
  StringView expectedFilename_local;
  StringView actualFilename_local;
  
  expectedFilename_local._data = (char *)expectedFilename._sizePlusFlags;
  this_local = (Comparator<Corrade::TestSuite::Compare::File> *)expectedFilename._data;
  actualFilename_local._data = (char *)actualFilename._sizePlusFlags;
  expectedFilename_local._sizePlusFlags = (size_t)actualFilename._data;
  local_38 = this;
  pSVar4 = Containers::
           Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>::
           operator->(&this->_state);
  local_68 = (pSVar4->pathPrefix)._data;
  sStack_60 = (pSVar4->pathPrefix)._sizePlusFlags;
  local_78 = (undefined4)expectedFilename_local._sizePlusFlags;
  uStack_74 = expectedFilename_local._sizePlusFlags._4_4_;
  uStack_70 = actualFilename_local._data._0_4_;
  uStack_6c = actualFilename_local._data._4_4_;
  Corrade::Utility::Path::join
            (&local_50,local_68,sStack_60,expectedFilename_local._sizePlusFlags,
             actualFilename_local._data);
  pSVar4 = Containers::
           Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>::
           operator->(&this->_state);
  Corrade::Containers::String::operator=(&pSVar4->actualFilename,&local_50);
  Corrade::Containers::String::~String(&local_50);
  pSVar4 = Containers::
           Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>::
           operator->(&this->_state);
  pCVar1 = this_local;
  actualContents._set = this_local._0_1_;
  actualContents._25_3_ = this_local._1_3_;
  actualContents._28_4_ = this_local._4_4_;
  this_local = pCVar1;
  Corrade::Utility::Path::join
            (&local_a0,(pSVar4->pathPrefix)._data,(pSVar4->pathPrefix)._sizePlusFlags,pCVar1,
             expectedFilename_local._data);
  pSVar4 = Containers::
           Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>::
           operator->(&this->_state);
  Corrade::Containers::String::operator=(&pSVar4->expectedFilename,&local_a0);
  Corrade::Containers::String::~String(&local_a0);
  Containers::Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>::
  operator->(&this->_state);
  Corrade::Containers::BasicStringView<char_const>::BasicStringView((String *)local_f8);
  Corrade::Utility::Path::readString((Optional *)local_e8,local_f8._0_8_,local_f8._8_8_);
  bVar2 = Containers::Optional::operator_cast_to_bool((Optional *)local_e8);
  if (bVar2) {
    ptVar5 = Utility::move<Corrade::Containers::Optional<Corrade::Containers::String>&>
                       ((Optional<Corrade::Containers::String> *)local_e8);
    Containers::Optional<Corrade::Containers::String>::operator*
              ((String *)&expectedContents._set,ptVar5);
    pSVar4 = Containers::
             Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>::
             operator->(&this->_state);
    Corrade::Containers::String::operator=(&pSVar4->actualContents,(String *)&expectedContents._set)
    ;
    Corrade::Containers::String::~String((String *)&expectedContents._set);
    pSVar4 = Containers::
             Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>::
             operator->(&this->_state);
    pSVar4->actualResult = Success;
    Containers::Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>::
    operator->(&this->_state);
    Corrade::Containers::BasicStringView<char_const>::BasicStringView((String *)local_148);
    Corrade::Utility::Path::readString(local_138,local_148._0_8_,local_148._8_8_);
    bVar2 = Containers::Optional::operator_cast_to_bool((Optional *)local_138);
    if (bVar2) {
      ptVar5 = Utility::move<Corrade::Containers::Optional<Corrade::Containers::String>&>
                         ((Optional<Corrade::Containers::String> *)local_138);
      Containers::Optional<Corrade::Containers::String>::operator*(&local_168,ptVar5);
      pSVar4 = Containers::
               Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>::
               operator->(&this->_state);
      Corrade::Containers::String::operator=(&pSVar4->expectedContents,&local_168);
      Corrade::Containers::String::~String(&local_168);
      pSVar4 = Containers::
               Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>::
               operator->(&this->_state);
      pSVar4->expectedResult = Success;
      Containers::Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>
      ::operator->(&this->_state);
      Corrade::Containers::BasicStringView<char_const>::BasicStringView
                ((String *)(local_188 + 0x10));
      Containers::Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::File>::State>
      ::operator->(&this->_state);
      Corrade::Containers::BasicStringView<char_const>::BasicStringView((String *)local_188);
      bVar3 = Corrade::Containers::operator==
                        (local_188._16_8_,local_170,local_188._0_8_,local_188._8_8_);
      if ((bVar3 & 1) == 0) {
        Containers::EnumSet<Corrade::TestSuite::ComparisonStatusFlag,_(unsigned_char)'\xff'>::
        EnumSet(&local_189,Failed);
        actualFilename_local._sizePlusFlags._7_1_ = operator|(Diagnostic,local_189);
      }
      else {
        Containers::EnumSet<Corrade::TestSuite::ComparisonStatusFlag,_(unsigned_char)'\xff'>::
        EnumSet((EnumSet<Corrade::TestSuite::ComparisonStatusFlag,_(unsigned_char)__xff_> *)
                ((long)&actualFilename_local._sizePlusFlags + 7));
      }
    }
    else {
      Containers::EnumSet<Corrade::TestSuite::ComparisonStatusFlag,_(unsigned_char)'\xff'>::EnumSet
                (&local_149,Failed);
      actualFilename_local._sizePlusFlags._7_1_ = operator|(Diagnostic,local_149);
    }
    Containers::Optional<Corrade::Containers::String>::~Optional
              ((Optional<Corrade::Containers::String> *)local_138);
  }
  else {
    Containers::EnumSet<Corrade::TestSuite::ComparisonStatusFlag,_(unsigned_char)'\xff'>::EnumSet
              ((EnumSet<Corrade::TestSuite::ComparisonStatusFlag,_(unsigned_char)__xff_> *)
               ((long)&actualFilename_local._sizePlusFlags + 7),Failed);
  }
  Containers::Optional<Corrade::Containers::String>::~Optional
            ((Optional<Corrade::Containers::String> *)local_e8);
  return (ComparisonStatusFlags)actualFilename_local._sizePlusFlags._7_1_;
}

Assistant:

ComparisonStatusFlags Comparator<Compare::File>::operator()(const Containers::StringView actualFilename, const Containers::StringView expectedFilename) {
    _state->actualFilename = Utility::Path::join(_state->pathPrefix, actualFilename);
    _state->expectedFilename = Utility::Path::join(_state->pathPrefix, expectedFilename);

    /* Read the actual file contents before the expected so if the expected
       file can't be read, we can still save actual file contents */
    Containers::Optional<Containers::String> actualContents = Utility::Path::readString(_state->actualFilename);
    if(!actualContents)
        return ComparisonStatusFlag::Failed;

    _state->actualContents = *Utility::move(actualContents);
    _state->actualResult = Result::Success;

    /* If this fails, we already have the actual contents so we can save them */
    Containers::Optional<Containers::String> expectedContents = Utility::Path::readString(_state->expectedFilename);
    if(!expectedContents)
        return ComparisonStatusFlag::Diagnostic|ComparisonStatusFlag::Failed;

    _state->expectedContents = *Utility::move(expectedContents);
    _state->expectedResult = Result::Success;

    return _state->actualContents == _state->expectedContents ? ComparisonStatusFlags{} :
        ComparisonStatusFlag::Diagnostic|ComparisonStatusFlag::Failed;
}